

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int get_interinter_compound_mask_rate(ModeCosts *mode_costs,MB_MODE_INFO *mbmi)

{
  int iVar1;
  BLOCK_SIZE *in_RSI;
  long in_RDI;
  COMPOUND_TYPE compound_type;
  int local_20;
  int local_4;
  
  if (in_RSI[0x53] == BLOCK_8X4) {
    iVar1 = av1_is_wedge_used(*in_RSI);
    if (iVar1 == 0) {
      local_20 = 0;
    }
    else {
      local_20 = *(int *)(in_RDI + 0x40e8 + (ulong)*in_RSI * 0x40 + (long)(char)in_RSI[0x50] * 4) +
                 0x200;
    }
    local_4 = local_20;
  }
  else {
    local_4 = 0x200;
  }
  return local_4;
}

Assistant:

static inline int get_interinter_compound_mask_rate(
    const ModeCosts *const mode_costs, const MB_MODE_INFO *const mbmi) {
  const COMPOUND_TYPE compound_type = mbmi->interinter_comp.type;
  // This function will be called only for COMPOUND_WEDGE and COMPOUND_DIFFWTD
  if (compound_type == COMPOUND_WEDGE) {
    return av1_is_wedge_used(mbmi->bsize)
               ? av1_cost_literal(1) +
                     mode_costs
                         ->wedge_idx_cost[mbmi->bsize]
                                         [mbmi->interinter_comp.wedge_index]
               : 0;
  } else {
    assert(compound_type == COMPOUND_DIFFWTD);
    return av1_cost_literal(1);
  }
}